

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O1

XMLCh * __thiscall xercesc_4_0::DOMAttrImpl::getValue(DOMAttrImpl *this)

{
  short *psVar1;
  short *psVar2;
  DOMDocument *pDVar3;
  DOMNode *node;
  XMLCh *src;
  int iVar4;
  long *plVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  long lVar8;
  undefined8 *puVar9;
  DOMException *pDVar10;
  DOMNode *pDVar11;
  XMLCh XVar12;
  undefined8 *puVar13;
  XMLCh *pXVar14;
  XMLBuffer buf;
  XMLBuffer local_68;
  undefined4 extraout_var_01;
  
  pDVar11 = (this->fParent).fFirstChild;
  if (pDVar11 == (DOMNode *)0x0) {
    pXVar14 = L"";
  }
  else {
    plVar5 = (long *)__dynamic_cast(pDVar11,&DOMNode::typeinfo,&HasDOMChildImpl::typeinfo,
                                    0xfffffffffffffffe);
    if ((plVar5 == (long *)0x0) || (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0)) {
      pDVar10 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(pDVar10,0xb,0,XMLPlatformUtils::fgMemoryManager);
      __cxa_throw(pDVar10,&DOMException::typeinfo,DOMException::~DOMException);
    }
    lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
    if ((*(long *)(lVar6 + 8) == 0) &&
       (iVar4 = (*((this->fParent).fFirstChild)->_vptr_DOMNode[4])(), iVar4 == 3)) {
      iVar4 = (*((this->fParent).fFirstChild)->_vptr_DOMNode[3])();
      return (XMLCh *)CONCAT44(extraout_var,iVar4);
    }
    pDVar3 = (this->fParent).fOwnerDocument;
    pDVar11 = &pDVar3[-1].super_DOMNode;
    if (pDVar3 == (DOMDocument *)0x0) {
      pDVar11 = (DOMNode *)0x0;
    }
    local_68.fMemoryManager = *(MemoryManager **)(pDVar11 + 0x2c);
    local_68.fIndex = 0;
    local_68.fCapacity = 0x3ff;
    local_68.fFullSize = 0;
    local_68.fUsed = false;
    local_68.fFullHandler = (XMLBufferFullHandler *)0x0;
    local_68.fBuffer = (XMLCh *)0x0;
    iVar4 = (*(local_68.fMemoryManager)->_vptr_MemoryManager[3])(local_68.fMemoryManager,0x800);
    *(XMLCh *)CONCAT44(extraout_var_00,iVar4) = L'\0';
    node = (this->fParent).fFirstChild;
    src = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
    while (local_68.fBuffer = src, node != (DOMNode *)0x0) {
      getTextValue(this,node,&local_68);
      plVar5 = (long *)__dynamic_cast(node,&DOMNode::typeinfo,&HasDOMChildImpl::typeinfo,
                                      0xfffffffffffffffe);
      if ((plVar5 == (long *)0x0) || (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0)) {
        pDVar10 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(pDVar10,0xb,0,XMLPlatformUtils::fgMemoryManager);
        __cxa_throw(pDVar10,&DOMException::typeinfo,DOMException::~DOMException);
      }
      lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
      src = local_68.fBuffer;
      node = *(DOMNode **)(lVar6 + 8);
    }
    src[local_68.fIndex] = L'\0';
    if (src == (XMLCh *)0x0) {
      pXVar14 = (XMLCh *)0x0;
    }
    else {
      lVar6 = 0;
      do {
        psVar1 = (short *)((long)src + lVar6);
        lVar6 = lVar6 + 2;
      } while (*psVar1 != 0);
      uVar7 = (ulong)(ushort)*src;
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        XVar12 = src[1];
        if (XVar12 != L'\0') {
          pXVar14 = src + 2;
          do {
            uVar7 = (ulong)(ushort)XVar12 + (uVar7 >> 0x18) + uVar7 * 0x26;
            XVar12 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar12 != L'\0');
        }
        uVar7 = uVar7 % *(ulong *)(pDVar11 + 0x28);
      }
      lVar6 = (lVar6 >> 1) + -1;
      puVar9 = *(undefined8 **)(*(long *)(pDVar11 + 0x27) + uVar7 * 8);
      if (puVar9 == (undefined8 *)0x0) {
        puVar13 = (undefined8 *)(*(long *)(pDVar11 + 0x27) + uVar7 * 8);
      }
      else {
        do {
          puVar13 = puVar9;
          if (puVar13[1] == lVar6) {
            pXVar14 = (XMLCh *)(puVar13 + 2);
            if (pXVar14 == src) goto LAB_002617f8;
            lVar8 = 0;
            do {
              psVar1 = (short *)((long)pXVar14 + lVar8);
              if (*psVar1 == 0) {
                if (*(short *)((long)src + lVar8) == 0) goto LAB_002617f8;
                break;
              }
              psVar2 = (short *)((long)src + lVar8);
              lVar8 = lVar8 + 2;
            } while (*psVar1 == *psVar2);
          }
          puVar9 = (undefined8 *)*puVar13;
        } while ((undefined8 *)*puVar13 != (undefined8 *)0x0);
      }
      iVar4 = (*pDVar11->_vptr_DOMNode[4])(pDVar11,lVar6 * 2 + 0x18);
      puVar9 = (undefined8 *)CONCAT44(extraout_var_01,iVar4);
      *puVar13 = puVar9;
      puVar9[1] = lVar6;
      *puVar9 = 0;
      pXVar14 = (XMLCh *)(puVar9 + 2);
      XMLString::copyString(pXVar14,src);
    }
LAB_002617f8:
    (*(local_68.fMemoryManager)->_vptr_MemoryManager[4])(local_68.fMemoryManager,local_68.fBuffer);
  }
  return pXVar14;
}

Assistant:

const XMLCh * DOMAttrImpl::getValue() const
{
    if (fParent.fFirstChild == 0) {
        return XMLUni::fgZeroLenString; // return "";
    }

    // Simple case where attribute value is just a single text node
    DOMNode *node = castToChildImpl(fParent.fFirstChild)->nextSibling;
    if (node == 0 && fParent.fFirstChild->getNodeType() == DOMNode::TEXT_NODE) {
        return fParent.fFirstChild->getNodeValue();
    }

    //
    // Complicated case where attribute value is a DOM tree
    //
    // According to the spec, the child nodes of the Attr node may be either
    // Text or EntityReference nodes.
    //
    // The parser will not create such thing, this is for those created by users.
    //
    // In such case, we have to visit each child to retrieve the text
    //

    DOMDocumentImpl* doc = (DOMDocumentImpl*)fParent.fOwnerDocument;

    XMLBuffer buf(1023, doc->getMemoryManager());
    for (node = fParent.fFirstChild; node != 0; node = castToChildImpl(node)->nextSibling)
        getTextValue(node, buf);

    return doc->getPooledString(buf.getRawBuffer());
}